

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O0

void __thiscall
QCryptographicHashPrivate::State::finalizeUnchecked(State *this,Algorithm method,HashResult *result)

{
  Algorithm in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int length_1;
  int length;
  blake2s_state copy_10;
  blake2b_state copy_9;
  SHA3Context copy_8;
  SHA3Context copy_7;
  SHA512Context copy_6;
  SHA384Context copy_5;
  SHA256Context copy_4;
  SHA224Context copy_3;
  MD5Context copy_2;
  md4_context copy_1;
  Sha1State copy;
  uchar *in_stack_fffffffffffff618;
  SHA384Context *in_stack_fffffffffffff620;
  Sha3Variant SVar1;
  undefined1 *outlen;
  Sha1State *in_stack_fffffffffffff628;
  SHA3Context *in_stack_fffffffffffff630;
  blake2s_state *S;
  undefined1 *local_8f8;
  undefined1 *puStack_8f0;
  undefined1 *local_8e8;
  undefined1 *puStack_8e0;
  uint32_t local_8d8 [2];
  uint32_t auStack_8d0 [2];
  undefined1 *local_8c8;
  undefined1 *puStack_8c0;
  undefined1 *local_8b8;
  undefined1 *puStack_8b0;
  undefined1 *local_8a8;
  undefined1 *puStack_8a0;
  undefined1 *local_898;
  undefined1 *puStack_890;
  undefined1 *local_888;
  undefined1 *puStack_880;
  undefined1 *local_878;
  undefined1 *local_868;
  undefined1 *puStack_860;
  undefined1 *local_858;
  undefined1 *puStack_850;
  undefined1 *local_848;
  undefined1 *puStack_840;
  undefined1 *local_838;
  undefined1 *puStack_830;
  undefined1 *local_828;
  undefined1 *puStack_820;
  undefined1 *local_818;
  undefined1 *puStack_810;
  undefined1 *local_808;
  undefined1 *puStack_800;
  undefined1 *local_7f8;
  undefined1 *puStack_7f0;
  undefined1 *local_7e8;
  undefined1 *puStack_7e0;
  undefined1 *local_7d8;
  undefined1 *puStack_7d0;
  undefined1 *local_7c8;
  undefined1 *puStack_7c0;
  undefined1 *local_7b8;
  undefined1 *puStack_7b0;
  undefined1 *local_7a8;
  undefined1 *puStack_7a0;
  undefined1 *local_798;
  undefined1 *puStack_790;
  undefined1 *local_788;
  undefined1 *puStack_780;
  undefined1 *local_778;
  undefined1 local_768 [416];
  undefined1 local_5c8 [416];
  undefined1 *local_428;
  undefined1 *puStack_420;
  undefined1 *local_418;
  undefined1 *puStack_410;
  undefined1 *local_408;
  undefined1 *puStack_400;
  undefined1 *local_3f8;
  undefined1 *puStack_3f0;
  undefined1 *local_3e8;
  undefined1 *puStack_3e0;
  undefined1 *local_3d8;
  undefined1 *puStack_3d0;
  undefined1 *local_3c8;
  undefined1 *puStack_3c0;
  undefined1 *local_3b8;
  undefined1 *puStack_3b0;
  undefined1 *local_3a8;
  undefined1 *puStack_3a0;
  undefined1 *local_398;
  undefined1 *puStack_390;
  undefined1 *local_388;
  undefined1 *puStack_380;
  undefined1 *local_378;
  undefined1 *puStack_370;
  undefined1 *local_368;
  undefined1 *puStack_360;
  undefined1 *local_358;
  undefined1 *puStack_350;
  undefined1 *local_348;
  undefined1 *puStack_340;
  undefined1 *local_338;
  undefined1 *puStack_330;
  undefined1 *local_328;
  undefined1 *puStack_320;
  undefined1 *local_318;
  undefined1 *puStack_310;
  undefined1 *local_308;
  undefined1 *puStack_300;
  undefined1 *local_2f8;
  undefined1 *puStack_2f0;
  undefined1 *local_2e8;
  undefined1 *puStack_2e0;
  undefined1 *local_2d8;
  undefined1 *puStack_2d0;
  undefined1 *local_2c8;
  undefined1 *puStack_2c0;
  undefined1 *local_2b8;
  undefined1 *puStack_2b0;
  undefined1 *local_2a8;
  undefined1 *puStack_2a0;
  undefined1 *local_298;
  undefined1 *puStack_290;
  undefined1 *local_288;
  undefined1 *puStack_280;
  undefined1 *local_278;
  undefined1 *puStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined4 local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined4 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_ESI) {
  case Md4:
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
    memcpy(&local_108,in_RDI,0x98);
    QSmallByteArray<64UL>::data((QSmallByteArray<64UL> *)0x58d3a6);
    md4_final((md4_context *)in_stack_fffffffffffff630,(uchar *)in_stack_fffffffffffff628);
    break;
  case Md5:
    local_118 = in_RDI[10];
    local_128 = in_RDI[8];
    uStack_120 = in_RDI[9];
    local_168 = *in_RDI;
    uStack_160 = in_RDI[1];
    local_158 = in_RDI[2];
    uStack_150 = in_RDI[3];
    local_148 = in_RDI[4];
    uStack_140 = in_RDI[5];
    local_138 = in_RDI[6];
    uStack_130 = in_RDI[7];
    QSmallByteArray<64UL>::data((QSmallByteArray<64UL> *)0x58d45a);
    MD5Final((MD5Context *)in_stack_fffffffffffff630,(md5byte *)in_stack_fffffffffffff628);
    break;
  case Sha1:
    local_18 = in_RDI[10];
    uStack_10 = in_RDI[0xb];
    local_28 = in_RDI[8];
    uStack_20 = in_RDI[9];
    local_68 = *in_RDI;
    uStack_60 = in_RDI[1];
    local_58 = in_RDI[2];
    uStack_50 = in_RDI[3];
    local_48 = in_RDI[4];
    uStack_40 = in_RDI[5];
    local_38 = in_RDI[6];
    uStack_30 = in_RDI[7];
    sha1FinalizeState(in_stack_fffffffffffff628);
    QSmallByteArray<64UL>::data((QSmallByteArray<64UL> *)0x58d2f7);
    sha1ToHash((Sha1State *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    break;
  case Sha224:
    local_178 = *(undefined4 *)(in_RDI + 0xe);
    local_188 = in_RDI[0xc];
    uStack_180 = in_RDI[0xd];
    local_198 = in_RDI[10];
    uStack_190 = in_RDI[0xb];
    local_1a8 = in_RDI[8];
    uStack_1a0 = in_RDI[9];
    local_1e8 = *in_RDI;
    uStack_1e0 = in_RDI[1];
    local_1d8 = in_RDI[2];
    uStack_1d0 = in_RDI[3];
    local_1c8 = in_RDI[4];
    uStack_1c0 = in_RDI[5];
    local_1b8 = in_RDI[6];
    uStack_1b0 = in_RDI[7];
    QSmallByteArray<64UL>::data((QSmallByteArray<64UL> *)0x58d52d);
    SHA224Result((SHA224Context *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    break;
  case Sha256:
    local_1f8 = *(undefined4 *)(in_RDI + 0xe);
    local_208 = in_RDI[0xc];
    uStack_200 = in_RDI[0xd];
    local_218 = in_RDI[10];
    uStack_210 = in_RDI[0xb];
    local_228 = in_RDI[8];
    uStack_220 = in_RDI[9];
    local_268 = *in_RDI;
    uStack_260 = in_RDI[1];
    local_258 = in_RDI[2];
    uStack_250 = in_RDI[3];
    local_248 = in_RDI[4];
    uStack_240 = in_RDI[5];
    local_238 = in_RDI[6];
    uStack_230 = in_RDI[7];
    QSmallByteArray<64UL>::data((QSmallByteArray<64UL> *)0x58d600);
    SHA256Result((SHA256Context *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    break;
  case Sha384:
    local_278 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_270 = &DAT_aaaaaaaaaaaaaaaa;
    local_288 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_280 = &DAT_aaaaaaaaaaaaaaaa;
    local_298 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_290 = &DAT_aaaaaaaaaaaaaaaa;
    local_2a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_2a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_2b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_2c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_2d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_2d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_2e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_2e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_2f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_2f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_308 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_300 = &DAT_aaaaaaaaaaaaaaaa;
    local_318 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_310 = &DAT_aaaaaaaaaaaaaaaa;
    local_328 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_320 = &DAT_aaaaaaaaaaaaaaaa;
    local_338 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_330 = &DAT_aaaaaaaaaaaaaaaa;
    local_348 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_340 = &DAT_aaaaaaaaaaaaaaaa;
    memcpy(&local_348,in_RDI,0xe0);
    QSmallByteArray<64UL>::data((QSmallByteArray<64UL> *)0x58d6c5);
    SHA384Result(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    break;
  case Sha512:
    local_358 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_350 = &DAT_aaaaaaaaaaaaaaaa;
    local_368 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_360 = &DAT_aaaaaaaaaaaaaaaa;
    local_378 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_370 = &DAT_aaaaaaaaaaaaaaaa;
    local_388 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_380 = &DAT_aaaaaaaaaaaaaaaa;
    local_398 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_390 = &DAT_aaaaaaaaaaaaaaaa;
    local_3a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_3a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_3b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_3b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_3c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_3c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_3d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_3d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_3e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_3e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_3f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_3f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_408 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_400 = &DAT_aaaaaaaaaaaaaaaa;
    local_418 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_410 = &DAT_aaaaaaaaaaaaaaaa;
    local_428 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_420 = &DAT_aaaaaaaaaaaaaaaa;
    memcpy(&local_428,in_RDI,0xe0);
    QSmallByteArray<64UL>::data((QSmallByteArray<64UL> *)0x58d784);
    SHA512Result(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    break;
  case Keccak_224:
  case Keccak_256:
  case Keccak_384:
  case Keccak_512:
    memset(local_768,0xaa,0x1a0);
    SVar1 = (Sha3Variant)((ulong)in_stack_fffffffffffff620 >> 0x20);
    memcpy(local_768,in_RDI,0x1a0);
    sha3Finish(in_stack_fffffffffffff630,(HashResult *)in_stack_fffffffffffff628,SVar1);
    break;
  case RealSha3_224:
  case RealSha3_256:
  case RealSha3_384:
  case RealSha3_512:
    memset(local_5c8,0xaa,0x1a0);
    SVar1 = (Sha3Variant)((ulong)in_stack_fffffffffffff620 >> 0x20);
    memcpy(local_5c8,in_RDI,0x1a0);
    sha3Finish(in_stack_fffffffffffff630,(HashResult *)in_stack_fffffffffffff628,SVar1);
    break;
  case Blake2b_160:
  case Blake2b_256:
  case Blake2b_384:
  case Blake2b_512:
    hashLengthInternal(in_ESI);
    local_778 = &DAT_aaaaaaaaaaaaaaaa;
    local_788 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_780 = &DAT_aaaaaaaaaaaaaaaa;
    local_798 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_790 = &DAT_aaaaaaaaaaaaaaaa;
    local_7a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_7a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_7b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_7b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_7c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_7c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_7d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_7d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_7e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_7e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_7f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_7f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_808 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_800 = &DAT_aaaaaaaaaaaaaaaa;
    local_818 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_810 = &DAT_aaaaaaaaaaaaaaaa;
    local_828 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_820 = &DAT_aaaaaaaaaaaaaaaa;
    local_838 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_830 = &DAT_aaaaaaaaaaaaaaaa;
    local_848 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_840 = &DAT_aaaaaaaaaaaaaaaa;
    local_858 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_850 = &DAT_aaaaaaaaaaaaaaaa;
    local_868 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_860 = &DAT_aaaaaaaaaaaaaaaa;
    memcpy(&local_868,in_RDI,0xf8);
    QSmallByteArray<64UL>::data((QSmallByteArray<64UL> *)0x58d916);
    blake2b_final((blake2b_state *)in_stack_fffffffffffff630,in_stack_fffffffffffff628,
                  (size_t)in_stack_fffffffffffff620);
    break;
  case Blake2s_128:
  case Blake2s_160:
  case Blake2s_224:
  case Blake2s_256:
    hashLengthInternal(in_ESI);
    local_878 = &DAT_aaaaaaaaaaaaaaaa;
    outlen = &DAT_aaaaaaaaaaaaaaaa;
    local_888 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_880 = &DAT_aaaaaaaaaaaaaaaa;
    local_898 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_890 = &DAT_aaaaaaaaaaaaaaaa;
    local_8a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_8a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_8b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_8b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_8c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_8c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_8d8 = (uint32_t  [2])&DAT_aaaaaaaaaaaaaaaa;
    auStack_8d0 = (uint32_t  [2])&DAT_aaaaaaaaaaaaaaaa;
    local_8e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_8e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_8f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_8f0 = &DAT_aaaaaaaaaaaaaaaa;
    S = (blake2s_state *)&local_8f8;
    memcpy(S,in_RDI,0x88);
    QSmallByteArray<64UL>::data((QSmallByteArray<64UL> *)0x58d9ce);
    blake2s_final(S,in_stack_fffffffffffff628,(size_t)outlen);
    break;
  case NumAlgorithms:
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCryptographicHashPrivate::State::finalizeUnchecked(QCryptographicHash::Algorithm method,
                                                         HashResult &result) noexcept
{
    switch (method) {
    case QCryptographicHash::Sha1: {
        Sha1State copy = sha1Context;
        sha1FinalizeState(&copy);
        sha1ToHash(&copy, result.data());
        break;
    }
    case QCryptographicHash::Md4: {
        md4_context copy = md4Context;
        md4_final(&copy, result.data());
        break;
    }
    case QCryptographicHash::Md5: {
        MD5Context copy = md5Context;
        MD5Final(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha224: {
        SHA224Context copy = sha224Context;
        SHA224Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha256: {
        SHA256Context copy = sha256Context;
        SHA256Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha384: {
        SHA384Context copy = sha384Context;
        SHA384Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha512: {
        SHA512Context copy = sha512Context;
        SHA512Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::RealSha3_224:
    case QCryptographicHash::RealSha3_256:
    case QCryptographicHash::RealSha3_384:
    case QCryptographicHash::RealSha3_512: {
        SHA3Context copy = sha3Context;
        sha3Finish(copy, result, Sha3Variant::Sha3);
        break;
    }
    case QCryptographicHash::Keccak_224:
    case QCryptographicHash::Keccak_256:
    case QCryptographicHash::Keccak_384:
    case QCryptographicHash::Keccak_512: {
        SHA3Context copy = sha3Context;
        sha3Finish(copy, result, Sha3Variant::Keccak);
        break;
    }
    case QCryptographicHash::Blake2b_160:
    case QCryptographicHash::Blake2b_256:
    case QCryptographicHash::Blake2b_384:
    case QCryptographicHash::Blake2b_512: {
        const auto length = hashLengthInternal(method);
        blake2b_state copy = blake2bContext;
        blake2b_final(&copy, result.data(), length);
        break;
    }
    case QCryptographicHash::Blake2s_128:
    case QCryptographicHash::Blake2s_160:
    case QCryptographicHash::Blake2s_224:
    case QCryptographicHash::Blake2s_256: {
        const auto length = hashLengthInternal(method);
        blake2s_state copy = blake2sContext;
        blake2s_final(&copy, result.data(), length);
        break;
    }
    case QCryptographicHash::NumAlgorithms:
        Q_UNREACHABLE();
    }
}